

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

SQTable * __thiscall SQTable::Clone(SQTable *this)

{
  SQSharedState *ss;
  SQInteger nInitialSize;
  SQTable *this_00;
  SQObjectValue SVar1;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  ss = (this->super_SQDelegable).super_SQCollectable._sharedstate;
  nInitialSize = this->_numofnodes;
  this_00 = (SQTable *)sq_vm_malloc(0x58);
  SQTable(this_00,ss,nInitialSize);
  SVar1.pTable = (SQTable *)0x0;
  (this_00->super_SQDelegable)._delegate = (SQTable *)0x0;
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_50.super_SQObject._type = OT_NULL;
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  while( true ) {
    local_60.super_SQObject._type = OT_INTEGER;
    local_60.super_SQObject._unVal = SVar1;
    SVar1.nInteger = Next(this,true,&local_60,&local_40,&local_50);
    SQObjectPtr::~SQObjectPtr(&local_60);
    if (SVar1.pTable == (SQTable *)0xffffffffffffffff) break;
    NewSlot(this_00,&local_40,&local_50);
  }
  SQDelegable::SetDelegate((SQDelegable *)this_00,(this->super_SQDelegable)._delegate);
  SQObjectPtr::~SQObjectPtr(&local_50);
  SQObjectPtr::~SQObjectPtr(&local_40);
  return this_00;
}

Assistant:

SQTable *SQTable::Clone()
{
    SQTable *nt=Create(_opt_ss(this),_numofnodes);
#ifdef _FAST_CLONE
    _HashNode *basesrc = _nodes;
    _HashNode *basedst = nt->_nodes;
    _HashNode *src = _nodes;
    _HashNode *dst = nt->_nodes;
    SQInteger n = 0;
    for(n = 0; n < _numofnodes; n++) {
        dst->key = src->key;
        dst->val = src->val;
        if(src->next) {
            assert(src->next > basesrc);
            dst->next = basedst + (src->next - basesrc);
            assert(dst != dst->next);
        }
        dst++;
        src++;
    }
    assert(_firstfree > basesrc);
    assert(_firstfree != NULL);
    nt->_firstfree = basedst + (_firstfree - basesrc);
    nt->_usednodes = _usednodes;
#else
    SQInteger ridx=0;
    SQObjectPtr key,val;
    while((ridx=Next(true,ridx,key,val))!=-1){
        nt->NewSlot(key,val);
    }
#endif
    nt->SetDelegate(_delegate);
    return nt;
}